

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::analysis::ConstantManager::CreateCompositeInstruction
          (ConstantManager *this,uint32_t result_id,CompositeConstant *cc,uint32_t type_id)

{
  Constant *c;
  uint32_t type_id_00;
  Op OVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  undefined8 *puVar2;
  TypeManager *this_02;
  undefined4 in_register_0000000c;
  spv_opcode_table psVar3;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> tVar4;
  uint32_t index;
  undefined4 in_register_00000034;
  ConstantManager *this_03;
  spv_target_env in_R8D;
  undefined8 *puVar5;
  uint32_t uVar6;
  uint32_t type;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  undefined1 local_78 [40];
  undefined8 local_50;
  undefined1 local_48 [24];
  
  this_03 = (ConstantManager *)CONCAT44(in_register_00000034,result_id);
  psVar3 = (spv_opcode_table)CONCAT44(in_register_0000000c,type_id);
  local_78._12_4_ = SUB84(cc,0);
  local_48._0_8_ =
       (__uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>)0x0;
  local_48._8_8_ = (void *)0x0;
  local_48._16_8_ = 0;
  local_78._16_8_ = this;
  this_00 = IRContext::get_def_use_mgr(this_03->ctx_);
  local_78._8_4_ = in_R8D;
  this_01 = DefUseManager::GetDef(this_00,in_R8D);
  local_78._24_8_ = psVar3;
  puVar2 = (undefined8 *)(**(code **)(*(long *)psVar3 + 0xc0))(psVar3);
  puVar5 = (undefined8 *)*puVar2;
  puVar2 = (undefined8 *)puVar2[1];
  uVar6 = 0;
  do {
    if (puVar5 == puVar2) {
      if (local_78._8_4_ == SPV_ENV_UNIVERSAL_1_0) {
        this_02 = IRContext::get_type_mgr(this_03->ctx_);
        local_78._8_4_ =
             TypeManager::GetId(this_02,(Type *)*(spv_opcode_desc_t **)(local_78._24_8_ + 8));
      }
      tVar4.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              )local_78._16_8_;
      local_78._32_8_ = this_03->ctx_;
      local_78._0_4_ = OpConstantComposite;
      local_78._4_4_ = local_78._8_4_;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>
                ((spvtools *)local_78._16_8_,(IRContext **)(local_78 + 0x20),(Op *)local_78,
                 (uint *)(local_78 + 4),(uint *)(local_78 + 0xc),
                 (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_48
                );
LAB_00499f61:
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_48
                );
      return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
              )(tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                )tVar4.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    }
    c = (Constant *)*puVar5;
    type_id_00 = 0;
    if (this_01 != (Instruction *)0x0) {
      if (this_01->opcode_ == OpTypeArray) {
        index = 0;
      }
      else {
        index = uVar6;
        type_id_00 = 0;
        if (this_01->opcode_ != OpTypeStruct) goto LAB_00499eb7;
      }
      type_id_00 = Instruction::GetSingleWordInOperand(this_01,index);
    }
LAB_00499eb7:
    OVar1 = FindDeclaredConstant(this_03,c,type_id_00);
    if (OVar1 == OpNop) {
      *(undefined8 *)local_78._16_8_ = 0;
      tVar4.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              )local_78._16_8_;
      goto LAB_00499f61;
    }
    local_78._4_4_ = SPV_ENV_VULKAN_1_0;
    local_50._0_4_ = 1;
    local_50._4_4_ = 0;
    local_78._0_4_ = OVar1;
    local_78._32_8_ = (IRContext *)local_78;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_48,
               (spv_operand_type_t *)(local_78 + 4),
               (initializer_list<unsigned_int> *)(local_78 + 0x20));
    uVar6 = uVar6 + 1;
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<Instruction> ConstantManager::CreateCompositeInstruction(
    uint32_t result_id, const CompositeConstant* cc, uint32_t type_id) const {
  std::vector<Operand> operands;
  Instruction* type_inst = context()->get_def_use_mgr()->GetDef(type_id);
  uint32_t component_index = 0;
  for (const Constant* component_const : cc->GetComponents()) {
    uint32_t component_type_id = 0;
    if (type_inst && type_inst->opcode() == spv::Op::OpTypeStruct) {
      component_type_id = type_inst->GetSingleWordInOperand(component_index);
    } else if (type_inst && type_inst->opcode() == spv::Op::OpTypeArray) {
      component_type_id = type_inst->GetSingleWordInOperand(0);
    }
    uint32_t id = FindDeclaredConstant(component_const, component_type_id);

    if (id == 0) {
      // Cannot get the id of the component constant, while all components
      // should have been added to the module prior to the composite constant.
      // Cannot create OpConstantComposite instruction in this case.
      return nullptr;
    }
    operands.emplace_back(spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                          std::initializer_list<uint32_t>{id});
    component_index++;
  }
  uint32_t type =
      (type_id == 0) ? context()->get_type_mgr()->GetId(cc->type()) : type_id;
  return MakeUnique<Instruction>(context(), spv::Op::OpConstantComposite, type,
                                 result_id, std::move(operands));
}